

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Boolean UA_Node_hasSubTypeOrInstances(UA_Node *node)

{
  ulong uVar1;
  UA_Boolean UVar2;
  UA_Boolean UVar3;
  ulong uVar4;
  UA_ReferenceNode *n1;
  UA_Boolean UVar5;
  bool bVar6;
  undefined1 local_68 [8];
  UA_NodeId hasSubType;
  UA_NodeId hasTypeDefinition;
  
  local_68._0_2_ = 0;
  stack0xffffffffffffff9c = 0x2d00000000;
  hasSubType.identifier._8_2_ = 0;
  stack0xffffffffffffffb4 = 0x2800000000;
  uVar1 = node->referencesSize;
  UVar5 = uVar1 != 0;
  if (UVar5) {
    n1 = node->references;
    uVar4 = 1;
    do {
      UVar3 = n1->isInverse;
      if ((UVar3 == false) &&
         (UVar2 = UA_NodeId_equal(&n1->referenceTypeId,(UA_NodeId *)local_68), UVar2)) {
        return UVar5;
      }
      if ((UVar3 != false) &&
         (UVar3 = UA_NodeId_equal(&n1->referenceTypeId,
                                  (UA_NodeId *)((long)&hasSubType.identifier + 8)), UVar3)) {
        return UVar5;
      }
      UVar5 = uVar4 < uVar1;
      n1 = n1 + 1;
      bVar6 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return UVar5;
}

Assistant:

UA_Boolean
UA_Node_hasSubTypeOrInstances(const UA_Node *node) {
    const UA_NodeId hasSubType = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    const UA_NodeId hasTypeDefinition = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == false &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasSubType))
            return true;
        if(node->references[i].isInverse == true &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &hasTypeDefinition))
            return true;
    }
    return false;
}